

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneratedSaxParserParserTemplateBase.h
# Opt level: O2

UNION__gles_enumeration_type __thiscall
GeneratedSaxParser::ParserTemplateBase::toDataPrefix<COLLADASaxFWL15::UNION__gles_enumeration_type>
          (ParserTemplateBase *this,ParserChar *prefixedBuffer,ParserChar *prefixedBufferEnd,
          ParserChar **buffer,ParserChar *bufferEnd,bool *failed,
          _func_UNION__gles_enumeration_type_ParserChar_ptr_ptr_ParserChar_ptr_bool_ptr *toData)

{
  ParserChar *__dest;
  UNION__gles_enumeration_type UVar1;
  byte *pbVar2;
  byte *__src;
  size_t __n;
  size_t __n_00;
  ParserChar *__dest_00;
  ParserChar *newBufferPostParse;
  ParserChar *local_38;
  
  __src = (byte *)0x0;
  for (; prefixedBuffer != prefixedBufferEnd;
      prefixedBuffer = (ParserChar *)((byte *)prefixedBuffer + 1)) {
    pbVar2 = __src;
    if (__src == (byte *)0x0) {
      pbVar2 = (byte *)prefixedBuffer;
    }
    if ((0x100002600U >> (*prefixedBuffer & 0x3fU) & 1) == 0) {
      __src = pbVar2;
    }
    if (0x20 < (byte)*prefixedBuffer) {
      __src = pbVar2;
    }
  }
  if (__src != (byte *)0x0) {
    __n = 0;
    while ((0x20 < (ulong)(byte)(*buffer)[__n] ||
           ((0x100002600U >> ((ulong)(byte)(*buffer)[__n] & 0x3f) & 1) == 0))) {
      __n = __n + 1;
    }
    __n_00 = (long)prefixedBufferEnd - (long)__src;
    __dest = (ParserChar *)
             StackMemoryManager::newObject(&this->mStackMemoryManager,__n_00 + __n + 1);
    memcpy(__dest,__src,__n_00);
    __dest_00 = __dest + __n_00;
    memcpy(__dest_00,*buffer,__n);
    __dest_00[__n] = ' ';
    local_38 = __dest;
    UVar1 = (*toData)(&local_38,__dest + __n_00 + __n + 1,failed);
    *buffer = *buffer + ((long)local_38 - (long)__dest_00);
    return UVar1;
  }
  UVar1 = (*toData)(buffer,bufferEnd,failed);
  return UVar1;
}

Assistant:

DataType ParserTemplateBase::toDataPrefix(
        const ParserChar* prefixedBuffer,
        const ParserChar* prefixedBufferEnd,
        const ParserChar** buffer,
        const ParserChar* bufferEnd,
        bool& failed,
        DataType (*toData)( const ParserChar**, const ParserChar*, bool& )
        )
    {
        const ParserChar* prefixBufferPos = prefixedBuffer;
        const ParserChar* prefixBufferStartPos = 0;
        while ( prefixBufferPos != prefixedBufferEnd )
        {
            if (!Utils::isWhiteSpace(*prefixBufferPos ) && !prefixBufferStartPos)
                prefixBufferStartPos = prefixBufferPos;
            ++prefixBufferPos;
        }

        //if prefixedBuffer contains only white spaces, we can ignore it.
        if ( !prefixBufferStartPos )
            return toData(buffer, bufferEnd, failed);

        //find first whitespace in buffer
        const ParserChar* bufferPos = *buffer;
        while ( !Utils::isWhiteSpace(*bufferPos) )
            ++bufferPos;

        size_t prefixBufferSize = prefixBufferPos - prefixBufferStartPos;
        size_t bufferSize = bufferPos - *buffer;
        size_t newBufferSize = prefixBufferSize + bufferSize;
        ParserChar* newBuffer =  (ParserChar*)mStackMemoryManager.newObject((newBufferSize + 1)*sizeof(ParserChar));
        memcpy(newBuffer, prefixBufferStartPos, prefixBufferSize*sizeof(ParserChar));
        memcpy(newBuffer + prefixBufferSize, *buffer, bufferSize*sizeof(ParserChar));
        newBuffer[newBufferSize] = ' ';
        ParserChar* newBufferPostParse = newBuffer;
        DataType value = toData( (const ParserChar**)&newBufferPostParse, newBuffer + newBufferSize + 1, failed);
        *buffer += (newBufferPostParse - newBuffer - prefixBufferSize);

        // see comment in overloaded method
        //mStackMemoryManager.deleteObject();

        return value;
    }